

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  SourceLineInfo *_lineInfo;
  TestCase *_name;
  IStreamingReporter *pIVar1;
  size_t sVar2;
  bool _missingAssertions;
  uint uVar3;
  double _durationInSeconds;
  Timer timer;
  Counts diff;
  SectionStats testCaseSectionStats;
  SectionInfo testCaseSection;
  Timer local_140;
  Counts local_138;
  size_t local_118;
  size_t sStack_110;
  RedirectedStreams local_108;
  SectionInfo local_80;
  
  _name = this->m_activeTestCase;
  _lineInfo = &(_name->super_TestCaseInfo).lineInfo;
  SectionInfo::SectionInfo(&local_80,_lineInfo,(string *)_name);
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IStreamingReporter[8])(pIVar1,&local_80);
  local_118 = (this->m_totals).assertions.passed;
  sStack_110 = (this->m_totals).assertions.failed;
  sVar2 = (this->m_totals).assertions.failedButOk;
  this->m_shouldReportUnexpected = true;
  local_108.m_redirectedCout = (string *)_lineInfo->file;
  local_108.m_redirectedCerr = (string *)(_name->super_TestCaseInfo).lineInfo.line;
  (this->m_lastAssertionInfo).macroName.m_start = "TEST_CASE";
  (this->m_lastAssertionInfo).macroName.m_size = 9;
  (this->m_lastAssertionInfo).lineInfo.file = (char *)local_108.m_redirectedCout;
  (this->m_lastAssertionInfo).lineInfo.line = (size_t)local_108.m_redirectedCerr;
  (this->m_lastAssertionInfo).capturedExpression.m_start = "";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0;
  (this->m_lastAssertionInfo).resultDisposition = Normal;
  seedRng((this->m_config).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr);
  local_140.m_nanoseconds = 0;
  uVar3 = (*((this->m_reporter)._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl)->
            _vptr_IStreamingReporter[2])();
  if ((uVar3 & 1) == 0) {
    local_140.m_nanoseconds = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
  }
  else {
    RedirectedStreams::RedirectedStreams(&local_108,redirectedCout,redirectedCerr);
    local_140.m_nanoseconds = std::chrono::_V2::system_clock::now();
    invokeActiveTestCase(this);
    RedirectedStreams::~RedirectedStreams(&local_108);
  }
  _durationInSeconds = Timer::getElapsedSeconds(&local_140);
  local_138.passed = (this->m_totals).assertions.passed - local_118;
  local_138.failed = (this->m_totals).assertions.failed - sStack_110;
  local_138.failedButOk = (this->m_totals).assertions.failedButOk - sVar2;
  _missingAssertions = testForMissingAssertions(this,&local_138);
  (*this->m_testCaseTracker->_vptr_ITracker[8])();
  handleUnfinishedSections(this);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            (&this->m_messages);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            (&this->m_messageScopes);
  SectionStats::SectionStats
            ((SectionStats *)&local_108,&local_80,&local_138,_durationInSeconds,_missingAssertions);
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IStreamingReporter[0xb])(pIVar1,&local_108);
  SectionStats::~SectionStats((SectionStats *)&local_108);
  SectionInfo::~SectionInfo(&local_80);
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        seedRng(*m_config);

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }